

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChMovingAverage::ChMovingAverage(ChMovingAverage *this,valarray<double> *data,int n)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  uint uVar5;
  uint uVar6;
  double *pdVar7;
  double *pdVar8;
  ulong uVar9;
  double *pdVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  
  (this->m_out)._M_size = 0;
  (this->m_out)._M_data = (double *)0x0;
  lVar13 = data->_M_size << 0x20;
  uVar5 = (uint)data->_M_size;
  sVar14 = (size_t)(int)uVar5;
  if (lVar13 != 0) {
    operator_delete((this->m_out)._M_data);
    (this->m_out)._M_size = sVar14;
    pdVar3 = (double *)::operator_new(lVar13 >> 0x1d);
    (this->m_out)._M_data = pdVar3;
  }
  pdVar3 = (this->m_out)._M_data;
  if (lVar13 != 0) {
    memset(pdVar3,0,lVar13 >> 0x1d);
  }
  uVar2 = uVar5;
  if (n < (int)uVar5) {
    uVar2 = n;
  }
  if (0 < (int)uVar2) {
    pdVar8 = data->_M_data;
    pdVar7 = pdVar8 + -1;
    uVar9 = 0;
    pdVar4 = pdVar8;
    do {
      pdVar4 = pdVar4 + 1;
      pdVar3[uVar9] = pdVar8[uVar9];
      if (uVar9 != 0) {
        dVar1 = pdVar3[uVar9];
        uVar12 = 0;
        pdVar10 = pdVar7;
        do {
          dVar1 = dVar1 + *pdVar10 + pdVar4[uVar12];
          pdVar3[uVar9] = dVar1;
          uVar12 = uVar12 + 1;
          pdVar10 = pdVar10 + -1;
        } while (uVar9 != uVar12);
      }
      pdVar3[uVar9] = pdVar3[uVar9] / (double)((int)uVar9 * 2 + 1);
      uVar9 = uVar9 + 1;
      pdVar7 = pdVar7 + 1;
    } while (uVar9 != uVar2);
  }
  if (0 < (int)uVar2) {
    pdVar7 = data->_M_data;
    uVar9 = 0;
    uVar6 = uVar5;
    do {
      uVar6 = uVar6 - 1;
      iVar11 = ~(uint)uVar9 + uVar5;
      pdVar3[iVar11] = pdVar7[iVar11];
      if (uVar9 != 0) {
        pdVar8 = pdVar7 + (long)(int)uVar6 + -1;
        dVar1 = pdVar3[iVar11];
        uVar12 = 0;
        do {
          dVar1 = dVar1 + *pdVar8 + pdVar7[(long)(int)uVar6 + uVar12 + 1];
          pdVar3[iVar11] = dVar1;
          uVar12 = uVar12 + 1;
          pdVar8 = pdVar8 + -1;
        } while (uVar9 != uVar12);
      }
      pdVar3[iVar11] = pdVar3[iVar11] / (double)(int)((uint)uVar9 * 2 + 1);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar2);
  }
  if ((int)uVar2 < (int)(uVar5 - uVar2)) {
    pdVar7 = data->_M_data;
    if ((long)n < (long)sVar14) {
      sVar14 = (long)n;
    }
    iVar11 = (int)sVar14;
    pdVar4 = pdVar7 + sVar14 + 1;
    pdVar8 = pdVar7 + sVar14;
    do {
      pdVar3[sVar14] = pdVar7[sVar14];
      if (0 < n) {
        dVar1 = pdVar3[sVar14];
        lVar13 = -1;
        pdVar10 = pdVar4;
        do {
          dVar1 = dVar1 + pdVar8[lVar13] + *pdVar10;
          pdVar3[sVar14] = dVar1;
          pdVar10 = pdVar10 + 1;
          lVar13 = lVar13 + -1;
        } while (-lVar13 != (ulong)(n + 1));
      }
      pdVar3[sVar14] = pdVar3[sVar14] / (double)(n * 2 + 1);
      sVar14 = sVar14 + 1;
      pdVar4 = pdVar4 + 1;
      pdVar8 = pdVar8 + 1;
    } while (uVar5 + iVar11 + uVar2 * -2 != (int)sVar14);
  }
  return;
}

Assistant:

ChMovingAverage::ChMovingAverage(const std::valarray<double>& data, int n) {
    int np = (int)data.size();
    m_out.resize(np);

    // Start and end of data
    int lim = ChMin(n, np);
    for (int i = 0; i < lim; i++) {
        m_out[i] = data[i];
        for (int j = 1; j <= i; j++)
            m_out[i] += data[i - j] + data[i + j];
        m_out[i] /= (2 * i + 1);
    }

    for (int i = 0; i < lim; i++) {
        m_out[np - 1 - i] = data[np - 1 - i];
        for (int j = 1; j <= i; j++)
            m_out[np - 1 - i] += data[np - 1 - i - j] + data[np - 1 - i + j];
        m_out[np - 1 - i] /= (2 * i + 1);
    }

    // Middle values
    for (int i = lim; i < np - lim; i++) {
        m_out[i] = data[i];
        for (int j = 1; j <= n; j++)
            m_out[i] += data[i - j] + data[i + j];
        m_out[i] /= (2 * n + 1);
    }
}